

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void ZopfliCleanHash(ZopfliHash *h)

{
  free(h->head);
  free(h->prev);
  free(h->hashval);
  free(h->head2);
  free(h->prev2);
  free(h->hashval2);
  free(h->same);
  return;
}

Assistant:

void ZopfliCleanHash(ZopfliHash* h) {
  free(h->head);
  free(h->prev);
  free(h->hashval);

#ifdef ZOPFLI_HASH_SAME_HASH
  free(h->head2);
  free(h->prev2);
  free(h->hashval2);
#endif

#ifdef ZOPFLI_HASH_SAME
  free(h->same);
#endif
}